

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIASound.cpp
# Opt level: O3

void __thiscall
Atari2600::TIASound::apply_samples<(Outputs::Speaker::Action)1>
          (TIASound *this,size_t number_of_samples,MonoSample *target)

{
  byte bVar1;
  short sVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  bool bVar7;
  MonoSample output;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  
  if (number_of_samples != 0) {
    uVar10 = 0;
    do {
      sVar2 = this->per_channel_volume_;
      lVar11 = 0;
      iVar8 = 0;
      bVar4 = true;
      do {
        bVar7 = bVar4;
        iVar5 = this->divider_counter_[lVar11] + 1;
        this->divider_counter_[lVar11] = iVar5;
        uVar9 = 0;
        if (0xf < this->control_[lVar11]) goto LAB_002fbf03;
        iVar5 = iVar5 / 0x13;
        switch(this->control_[lVar11]) {
        default:
          uVar9 = 1;
          break;
        case '\x01':
          uVar6 = this->poly4_counter_[lVar11];
          uVar9 = uVar6 & 1;
          if (iVar5 == this->divider_[lVar11] + 1) {
            this->divider_counter_[lVar11] = 0;
            this->poly4_counter_[lVar11] = (uVar6 << 2 ^ uVar6 * 8) & 8 | (int)uVar6 >> 1;
          }
          break;
        case '\x02':
          uVar6 = this->poly4_counter_[lVar11];
          uVar9 = uVar6 & 1;
          bVar1 = this->divider_[lVar11];
          if (iVar5 % (int)(((uint)bVar1 * 0x20 - ((uint)bVar1 + (uint)bVar1)) + 0x1e) == 0x12) {
            this->poly4_counter_[lVar11] = (uVar6 << 2 ^ uVar6 * 8) & 8 | (int)uVar6 >> 1;
          }
          break;
        case '\x03':
          uVar9 = this->output_state_[lVar11];
          if (iVar5 == this->divider_[lVar11] + 1) {
            uVar6 = this->poly5_counter_[lVar11];
            if ((uVar6 & 1) != 0) {
              uVar3 = this->poly4_counter_[lVar11];
              this->output_state_[lVar11] = uVar3 & 1;
              this->poly4_counter_[lVar11] = (uVar3 << 2 ^ uVar3 * 8) & 8 | (int)uVar3 >> 1;
            }
            this->poly5_counter_[lVar11] = (uVar6 << 2 ^ uVar6 << 4) & 0x10 | (int)uVar6 >> 1;
          }
          break;
        case '\x04':
        case '\x05':
          iVar12 = this->divider_[lVar11] + 1;
          goto LAB_002fbcff;
        case '\x06':
        case '\n':
          iVar12 = this->divider_[lVar11] + 1;
          goto LAB_002fbd37;
        case '\a':
        case '\t':
          uVar6 = this->poly5_counter_[lVar11];
          iVar12 = this->divider_[lVar11] + 1;
          goto LAB_002fbe8e;
        case '\b':
          uVar6 = this->poly9_counter_[lVar11];
          uVar9 = uVar6 & 1;
          if (iVar5 == this->divider_[lVar11] + 1) {
            this->divider_counter_[lVar11] = 0;
            this->poly9_counter_[lVar11] = (uVar6 << 8 ^ uVar6 << 4) & 0x100 | (int)uVar6 >> 1;
          }
          break;
        case '\f':
        case '\r':
          iVar12 = (uint)this->divider_[lVar11] + (uint)this->divider_[lVar11] * 2 + 3;
LAB_002fbcff:
          uVar9 = iVar5 / iVar12 & 1;
          break;
        case '\x0e':
          iVar12 = (uint)this->divider_[lVar11] + (uint)this->divider_[lVar11] * 2 + 3;
LAB_002fbd37:
          uVar9 = (uint)((iVar5 / iVar12) % 0x1e < 0x13);
          break;
        case '\x0f':
          uVar6 = this->poly5_counter_[lVar11];
          iVar12 = (uint)this->divider_[lVar11] + (uint)this->divider_[lVar11] * 2 + 3;
LAB_002fbe8e:
          uVar9 = uVar6 & 1;
          if (iVar5 == iVar12) {
            this->divider_counter_[lVar11] = 0;
            this->poly5_counter_[lVar11] = (uVar6 << 2 ^ uVar6 << 4) & 0x10 | (int)uVar6 >> 1;
          }
        }
LAB_002fbf03:
        iVar8 = iVar8 + (this->volume_[lVar11] * uVar9 * (int)sVar2 >> 4);
        lVar11 = 1;
        bVar4 = false;
      } while (bVar7);
      target[uVar10] = target[uVar10] + (short)iVar8;
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (uVar10 < number_of_samples);
  }
  return;
}

Assistant:

void Atari2600::TIASound::apply_samples(std::size_t number_of_samples, Outputs::Speaker::MonoSample *target) {
	for(unsigned int c = 0; c < number_of_samples; c++) {
		Outputs::Speaker::MonoSample output = 0;
		for(int channel = 0; channel < 2; channel++) {
			divider_counter_[channel] ++;
			int divider_value = divider_counter_[channel] / (38 / CPUTicksPerAudioTick);
			int level = 0;
			switch(control_[channel]) {
				case 0x0: case 0xb:	// constant 1
					level = 1;
				break;

				case 0x4: case 0x5:	// div2 tone
					level = (divider_value / (divider_[channel]+1))&1;
				break;

				case 0xc: case 0xd:	// div6 tone
					level = (divider_value / ((divider_[channel]+1)*3))&1;
				break;

				case 0x6: case 0xa:	// div31 tone
					level = (divider_value / (divider_[channel]+1))%30 <= 18;
				break;

				case 0xe:			// div93 tone
					level = (divider_value / ((divider_[channel]+1)*3))%30 <= 18;
				break;

				case 0x1:			// 4-bit poly
					level = poly4_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly4(channel);
					}
				break;

				case 0x2:			// 4-bit poly div31
					level = poly4_counter_[channel]&1;
					if(divider_value%(30*(divider_[channel]+1)) == 18) {
						advance_poly4(channel);
					}
				break;

				case 0x3:			// 5/4-bit poly
					level = output_state_[channel];
					if(divider_value == divider_[channel]+1) {
						if(poly5_counter_[channel]&1) {
							output_state_[channel] = poly4_counter_[channel]&1;
							advance_poly4(channel);
						}
						advance_poly5(channel);
					}
				break;

				case 0x7: case 0x9:	// 5-bit poly
					level = poly5_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0xf:			// 5-bit poly div6
					level = poly5_counter_[channel]&1;
					if(divider_value == (divider_[channel]+1)*3) {
						divider_counter_[channel] = 0;
						advance_poly5(channel);
					}
				break;

				case 0x8:			// 9-bit poly
					level = poly9_counter_[channel]&1;
					if(divider_value == divider_[channel]+1) {
						divider_counter_[channel] = 0;
						advance_poly9(channel);
					}
				break;
			}

			output += (volume_[channel] * per_channel_volume_ * level) >> 4;
		}
		Outputs::Speaker::apply<action>(target[c], output);
	}
}